

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int __thiscall NULLCFile::FilePrint(NULLCFile *this,NULLCArray arr,File *file)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  char *error;
  size_t __n;
  
  lVar2 = CONCAT44((int)((ulong)register0x00000010 >> 0x20),arr.len);
  if (lVar2 == 0) {
    error = "ERROR: null pointer access";
  }
  else {
    if (*(FILE **)(lVar2 + 4) != (FILE *)0x0) {
      uVar4 = (uint)arr.ptr;
      if (uVar4 == 0) {
        __n = 0;
      }
      else {
        lVar3 = 0;
        do {
          if (this[lVar3] == (NULLCFile)0x0) {
            uVar4 = (uint)lVar3;
            break;
          }
          lVar3 = lVar3 + 1;
        } while (uVar4 != (uint)lVar3);
        __n = (size_t)uVar4;
      }
      if (this == (NULLCFile *)0x0) {
        return 0;
      }
      sVar1 = fwrite(this,1,__n,*(FILE **)(lVar2 + 4));
      return (uint)(sVar1 == __n);
    }
    error = "Cannot write to a closed file.";
    file = (File *)0x0;
  }
  nullcThrowError(error,arr.ptr,lVar2,file);
  return 0;
}

Assistant:

int FilePrint(NULLCArray arr, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		unsigned length = 0;
		for(; length < arr.len; length++)
		{
			if(!arr.ptr[length])
				break;
		}

		return arr.ptr ? length == fwrite(arr.ptr, 1, length, file->handle) : 0;
	}